

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall
slang::parsing::Lexer::Lexer
          (Lexer *this,BufferID bufferId,string_view source,char *startPtr,BumpAllocator *alloc,
          Diagnostics *diagnostics,SourceManager *sourceManager,LexerOptions *options)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  value_type_pointer ppVar4;
  LanguageVersion LVar5;
  SourceLocation location;
  char *pcVar6;
  long lVar7;
  
  this->alloc = alloc;
  this->diagnostics = diagnostics;
  sVar2 = (options->commentHandlers).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
          .arrays.groups_size_index;
  sVar3 = (options->commentHandlers).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
          .arrays.groups_size_mask;
  ppVar4 = (options->commentHandlers).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.elements_;
  (this->options).commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_ =
       (options->commentHandlers).table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
       .arrays.groups_;
  (this->options).commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.elements_ = ppVar4;
  (this->options).commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_size_index = sVar2;
  (this->options).commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_size_mask = sVar3;
  sVar2 = (options->commentHandlers).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
          .size_ctrl.size;
  (this->options).commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .size_ctrl.ml =
       (options->commentHandlers).table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
       .size_ctrl.ml;
  (this->options).commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .size_ctrl.size = sVar2;
  (options->commentHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (options->commentHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_size_mask = 1;
  (options->commentHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (options->commentHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .size_ctrl.size = 0;
  (options->commentHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (options->commentHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .size_ctrl.ml = 0;
  (this->options).enableLegacyProtect = options->enableLegacyProtect;
  LVar5 = options->languageVersion;
  (this->options).maxErrors = options->maxErrors;
  (this->options).languageVersion = LVar5;
  (this->bufferId).id = bufferId.id;
  this->originalBegin = source._M_str;
  this->sourceBuffer = startPtr;
  pcVar6 = source._M_str + source._M_len;
  this->sourceEnd = pcVar6;
  this->marker = (char *)0x0;
  this->errorCount = 0;
  (this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.data_ =
       (pointer)(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.firstElement;
  (this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.len = 0;
  (this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.cap = 0x20;
  (this->stringBuffer).super_SmallVectorBase<char>.data_ =
       (this->stringBuffer).super_SmallVectorBase<char>.firstElement;
  (this->stringBuffer).super_SmallVectorBase<char>.len = 0;
  (this->stringBuffer).super_SmallVectorBase<char>.cap = 0x28;
  this->library = (SourceLibrary *)0x0;
  this->sourceManager = sourceManager;
  lVar7 = (long)pcVar6 - (long)startPtr;
  if (lVar7 < 2) {
    return;
  }
  cVar1 = *startPtr;
  if (cVar1 == -2) {
    if (startPtr[1] != -1) goto LAB_003a5e8c;
  }
  else if ((cVar1 != -1) || (startPtr[1] != -2)) {
LAB_003a5e8c:
    if (cVar1 != -0x11 || lVar7 == 2) {
      return;
    }
    if (startPtr[1] != -0x45) {
      return;
    }
    if (startPtr[2] != -0x41) {
      return;
    }
    pcVar6 = startPtr + 3;
    goto LAB_003a5eda;
  }
  this->errorCount = 1;
  location._0_4_ = bufferId.id & 0xfffffff;
  location._4_4_ = 0;
  Diagnostics::add(this->diagnostics,(DiagCode)0x110002,location);
  pcVar6 = this->sourceBuffer + 2;
LAB_003a5eda:
  this->sourceBuffer = pcVar6;
  return;
}

Assistant:

Lexer::Lexer(BufferID bufferId, std::string_view source, const char* startPtr, BumpAllocator& alloc,
             Diagnostics& diagnostics, SourceManager& sourceManager, LexerOptions options) :
    alloc(alloc), diagnostics(diagnostics), options(std::move(options)), bufferId(bufferId),
    originalBegin(source.data()), sourceBuffer(startPtr),
    sourceEnd(source.data() + source.length()), marker(nullptr), sourceManager(sourceManager) {

    ptrdiff_t count = sourceEnd - sourceBuffer;
    SLANG_ASSERT(count);
    SLANG_ASSERT(sourceEnd[-1] == '\0');

    // detect BOMs so we can give nice errors for invalid encoding
    if (count >= 2) {
        const unsigned char* ubuf = reinterpret_cast<const unsigned char*>(sourceBuffer);
        if ((ubuf[0] == 0xFF && ubuf[1] == 0xFE) || (ubuf[0] == 0xFE && ubuf[1] == 0xFF)) {
            errorCount++;
            addDiag(diag::UnicodeBOM, 0);
            advance(2);
        }
        else if (count >= 3) {
            // Silently skip the UTF8 BOM.
            if (ubuf[0] == 0xEF && ubuf[1] == 0xBB && ubuf[2] == 0xBF)
                advance(3);
        }
    }
}